

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O1

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  void *pvVar26;
  float *pfVar27;
  int iVar28;
  float *pfVar29;
  int k;
  float *pfVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  undefined1 auVar35 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_108;
  ulong local_f0;
  allocator_type local_e1;
  ulong local_e0;
  Mat local_d8;
  void *local_a8;
  ulong local_a0;
  Pooling *local_98;
  float *local_90;
  float *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  float *local_68;
  void *local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar20 = bottom_blob->w;
  iVar7 = bottom_blob->h;
  uVar23 = bottom_blob->c;
  uVar15 = (ulong)uVar23;
  sVar14 = (size_t)(int)uVar23;
  if (this->global_pooling != 0) {
    if (((top_blob->dims != 1) || (top_blob->w != uVar23)) || (top_blob->elemsize != 4)) {
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 4;
      top_blob->dims = 1;
      top_blob->w = uVar23;
      top_blob->h = 1;
      top_blob->c = 1;
      top_blob->cstep = sVar14;
      if (uVar23 != 0) {
        pvVar8 = malloc(sVar14 * 4 + 0x1c);
        pvVar9 = (void *)((long)pvVar8 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 - 8) = pvVar8;
        top_blob->data = pvVar9;
        piVar3 = (int *)((long)pvVar9 + sVar14 * 4);
        top_blob->refcount = piVar3;
        *piVar3 = 1;
      }
    }
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar17 = iVar7 * iVar20;
    if (this->pooling_type == 0) {
      if ((int)uVar23 < 1) {
        return 0;
      }
      pvVar8 = bottom_blob->data;
      lVar10 = bottom_blob->cstep * bottom_blob->elemsize;
      pvVar9 = top_blob->data;
      uVar24 = 0;
      pvVar26 = pvVar8;
      do {
        fVar34 = *(float *)((long)pvVar8 + lVar10 * uVar24);
        if (0 < (int)uVar17) {
          uVar25 = 0;
          do {
            fVar1 = *(float *)((long)pvVar26 + uVar25 * 4);
            if (fVar34 <= fVar1) {
              fVar34 = fVar1;
            }
            uVar25 = uVar25 + 1;
          } while (uVar17 != uVar25);
        }
        *(float *)((long)pvVar9 + uVar24 * 4) = fVar34;
        uVar24 = uVar24 + 1;
        pvVar26 = (void *)((long)pvVar26 + lVar10);
      } while (uVar24 != uVar15);
    }
    else {
      if (this->pooling_type != 1) {
        return 0;
      }
      if ((int)uVar23 < 1) {
        return 0;
      }
      pvVar8 = bottom_blob->data;
      sVar14 = bottom_blob->cstep;
      pvVar9 = top_blob->data;
      sVar4 = bottom_blob->elemsize;
      uVar24 = 0;
      do {
        fVar34 = 0.0;
        if (0 < (int)uVar17) {
          uVar25 = 0;
          do {
            fVar34 = fVar34 + *(float *)((long)pvVar8 + uVar25 * 4);
            uVar25 = uVar25 + 1;
          } while (uVar17 != uVar25);
        }
        *(float *)((long)pvVar9 + uVar24 * 4) = fVar34 * (1.0 / (float)(int)uVar17);
        uVar24 = uVar24 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar14 * sVar4);
      } while (uVar24 != uVar15);
    }
    return 0;
  }
  local_d8.data = bottom_blob->data;
  local_d8.refcount = bottom_blob->refcount;
  local_d8.elemsize = bottom_blob->elemsize;
  local_d8.dims = bottom_blob->dims;
  if (local_d8.refcount != (int *)0x0) {
    LOCK();
    *local_d8.refcount = *local_d8.refcount + 1;
    UNLOCK();
  }
  local_d8.w = bottom_blob->w;
  local_d8.h = bottom_blob->h;
  local_d8.c = bottom_blob->c;
  local_d8.cstep = bottom_blob->cstep;
  if (this->pooling_type == 0) {
    fVar34 = -3.4028235e+38;
  }
  else {
    fVar34 = 0.0;
  }
  iVar19 = this->pad_mode;
  if (iVar19 == 2) {
    iVar19 = 0;
    iVar12 = ~((iVar20 + -1) % this->stride_w) + this->kernel_w;
    iVar28 = ~((iVar7 + -1) % this->stride_h) + this->kernel_h;
    if ((iVar12 < 1) && (iVar28 < 1)) {
LAB_00111267:
      bVar33 = true;
      iVar20 = local_d8.w;
      iVar7 = local_d8.h;
    }
    else {
      copy_make_border(bottom_blob,&local_d8,iVar28 / 2,iVar28 - iVar28 / 2,iVar12 / 2,
                       iVar12 - iVar12 / 2,0,fVar34);
      if (local_d8.data == (void *)0x0) {
        bVar33 = false;
      }
      else {
        if ((long)local_d8.c * local_d8.cstep != 0) goto LAB_00111267;
        bVar33 = false;
      }
    }
    iVar12 = -100;
    iVar28 = 0;
    if (!bVar33) goto LAB_001119c6;
  }
  else {
    if (iVar19 == 1) {
      copy_make_border(bottom_blob,&local_d8,this->pad_top,this->pad_bottom,this->pad_left,
                       this->pad_right,0,fVar34);
      iVar12 = -100;
      if ((local_d8.data == (void *)0x0) || ((long)local_d8.c * local_d8.cstep == 0))
      goto LAB_001119c6;
      iVar20 = local_d8.w;
      iVar7 = local_d8.h;
    }
    else if (iVar19 == 0) {
      iVar19 = ((iVar20 + this->pad_left + this->pad_right) - this->kernel_w) % this->stride_w;
      iVar12 = ((iVar7 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
      iVar28 = this->stride_w - iVar19;
      if (iVar19 == 0) {
        iVar28 = 0;
      }
      iVar19 = this->stride_h - iVar12;
      if (iVar12 == 0) {
        iVar19 = 0;
      }
      copy_make_border(bottom_blob,&local_d8,this->pad_top,this->pad_bottom + iVar19,this->pad_left,
                       this->pad_right + iVar28,0,fVar34);
      bVar33 = (long)local_d8.c * local_d8.cstep != 0;
      if (local_d8.data != (void *)0x0 && bVar33) {
        iVar20 = local_d8.w;
        iVar7 = local_d8.h;
      }
      iVar12 = -100;
      if (local_d8.data == (void *)0x0 || !bVar33) goto LAB_001119c6;
      goto LAB_00111323;
    }
    iVar19 = 0;
    iVar28 = 0;
  }
LAB_00111323:
  iVar5 = (iVar20 - this->kernel_w) / this->stride_w;
  uVar31 = iVar5 + 1;
  uVar24 = (long)(iVar7 - this->kernel_h) / (long)this->stride_h;
  local_a0 = uVar24 & 0xffffffff;
  uVar17 = (int)uVar24 + 1;
  local_e0 = (ulong)uVar17;
  auVar35._0_4_ = -(uint)(top_blob->dims == 3);
  auVar35._4_4_ = -(uint)(uVar31 == top_blob->w);
  auVar35._8_4_ = -(uint)(uVar17 == top_blob->h);
  auVar35._12_4_ = -(uint)(uVar23 == top_blob->c);
  iVar7 = movmskps(3,auVar35);
  if ((iVar7 != 0xf) || (top_blob->elemsize != 4)) {
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = uVar31;
    top_blob->h = (int)local_e0;
    top_blob->c = uVar23;
    uVar24 = (long)(int)((int)local_e0 * uVar31) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = uVar24;
    lVar10 = uVar24 * sVar14;
    if (lVar10 != 0) {
      pvVar8 = malloc(lVar10 * 4 + 0x1c);
      pvVar9 = (void *)((long)pvVar8 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 - 8) = pvVar8;
      top_blob->data = pvVar9;
      piVar3 = (int *)((long)pvVar9 + lVar10 * 4);
      top_blob->refcount = piVar3;
      *piVar3 = 1;
    }
  }
  iVar12 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar24 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar24,&local_e1);
    if (0 < this->kernel_h) {
      iVar7 = this->kernel_w;
      iVar12 = 0;
      iVar13 = 0;
      iVar21 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar10 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar21 + lVar10] = iVar13 + (int)lVar10;
            lVar10 = lVar10 + 1;
            iVar22 = (int)lVar10;
          } while (iVar22 < this->kernel_w);
          iVar21 = iVar21 + iVar22;
          iVar13 = iVar13 + iVar22;
        }
        iVar13 = iVar13 + (iVar20 - iVar7);
        iVar12 = iVar12 + 1;
      } while (iVar12 < this->kernel_h);
    }
    iVar20 = (int)uVar24;
    if (this->pooling_type == 0) {
      if (0 < (int)uVar23) {
        local_e0 = (ulong)(int)uVar31;
        local_88 = (float *)CONCAT44(local_88._4_4_,local_d8.w);
        local_90 = (float *)(top_blob->cstep * top_blob->elemsize);
        local_a8 = top_blob->data;
        local_f0 = 0;
        do {
          if (-1 < (int)local_a0) {
            pvVar8 = (void *)((long)local_90 * local_f0 + (long)local_a8);
            iVar7 = this->stride_h;
            iVar19 = this->stride_w;
            uVar25 = 0;
            do {
              if (-1 < iVar5) {
                lVar10 = (long)(iVar7 * local_d8.w * (int)uVar25) * 4 +
                         local_d8.cstep * local_d8.elemsize * local_f0;
                uVar18 = 0;
                do {
                  lVar16 = uVar18 * (long)iVar19;
                  fVar34 = *(float *)((long)local_d8.data + lVar16 * 4 + lVar10);
                  if (0 < iVar20) {
                    uVar32 = 0;
                    do {
                      fVar1 = *(float *)((long)local_d8.data +
                                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar32] * 4
                                        + lVar16 * 4 + lVar10);
                      if (fVar34 <= fVar1) {
                        fVar34 = fVar1;
                      }
                      uVar32 = uVar32 + 1;
                    } while ((uVar24 & 0xffffffff) != uVar32);
                  }
                  *(float *)((long)pvVar8 + uVar18 * 4) = fVar34;
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar31);
              }
              pvVar8 = (void *)((long)pvVar8 + local_e0 * 4);
              uVar25 = uVar25 + 1;
            } while (uVar25 != (int)local_a0 + 1);
          }
          local_f0 = local_f0 + 1;
        } while (local_f0 != uVar15);
      }
    }
    else if ((this->pooling_type == 1) && (0 < (int)uVar23)) {
      local_74 = -iVar19;
      local_58 = local_d8.cstep * local_d8.elemsize;
      local_a8 = (void *)(top_blob->cstep * top_blob->elemsize);
      lVar10 = (long)(int)uVar31;
      local_78 = this->pad_top;
      iVar7 = this->kernel_h;
      iVar12 = this->kernel_w;
      local_7c = this->pad_bottom;
      iVar13 = this->pad_left;
      iVar21 = this->pad_right;
      local_60 = local_d8.data;
      local_80 = local_d8.w;
      local_68 = (float *)top_blob->data;
      uVar25 = (ulong)uVar31;
      pfVar29 = local_68 + top_blob->w * (int)local_a0;
      local_50 = lVar10 * 4;
      local_108 = 0;
      pfVar27 = local_68 + iVar5;
      pfVar30 = local_68;
      pfVar6 = local_68;
      do {
        local_90 = pfVar6;
        local_88 = pfVar27;
        if (-1 < (int)local_a0) {
          pfVar27 = (float *)((long)local_a8 * local_108 + (long)local_68);
          iVar22 = this->stride_h;
          iVar2 = this->stride_w;
          uVar18 = 0;
          do {
            if (-1 < iVar5) {
              uVar32 = 0;
              do {
                if (iVar20 < 1) {
                  fVar34 = 0.0;
                }
                else {
                  fVar34 = 0.0;
                  uVar11 = 0;
                  do {
                    fVar34 = fVar34 + *(float *)((long)local_d8.data +
                                                (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar11] *
                                                4 + uVar32 * (long)iVar2 * 4 +
                                                    (long)(iVar22 * local_d8.w * (int)uVar18) * 4 +
                                                    local_58 * local_108);
                    uVar11 = uVar11 + 1;
                  } while ((uVar24 & 0xffffffff) != uVar11);
                }
                pfVar27[uVar32] = fVar34 * (1.0 / (float)iVar20);
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar25);
            }
            pfVar27 = pfVar27 + lVar10;
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_e0);
        }
        if ((local_78 != 0) && (-1 < iVar5)) {
          uVar18 = 0;
          do {
            pfVar30[uVar18] = pfVar30[uVar18] * (float)iVar7 * (1.0 / (float)(iVar7 - local_78));
            uVar18 = uVar18 + 1;
          } while (uVar25 != uVar18);
        }
        if ((local_7c != local_74) && (-1 < iVar5)) {
          uVar18 = 0;
          do {
            pfVar29[uVar18] =
                 pfVar29[uVar18] * (float)iVar7 * (1.0 / (float)(iVar7 - (iVar19 + local_7c)));
            uVar18 = uVar18 + 1;
          } while (uVar25 != uVar18);
        }
        if (iVar13 != 0 && -1 < (int)local_a0) {
          uVar18 = local_e0 & 0xffffffff;
          pfVar27 = local_90;
          do {
            *pfVar27 = *pfVar27 * (float)iVar12 * (1.0 / (float)(iVar12 - iVar13));
            pfVar27 = pfVar27 + lVar10;
            uVar23 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar23;
          } while (uVar23 != 0);
        }
        if (iVar21 != -iVar28 && -1 < (int)local_a0) {
          uVar18 = local_e0 & 0xffffffff;
          pfVar27 = local_88;
          do {
            *pfVar27 = *pfVar27 * (float)iVar12 * (1.0 / (float)(iVar12 - (iVar21 + iVar28)));
            pfVar27 = pfVar27 + lVar10;
            uVar23 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar23;
          } while (uVar23 != 0);
        }
        local_108 = local_108 + 1;
        pfVar30 = (float *)((long)pfVar30 + (long)local_a8);
        pfVar29 = (float *)((long)pfVar29 + (long)local_a8);
        pfVar27 = (float *)((long)local_88 + (long)local_a8);
        pfVar6 = (float *)((long)local_90 + (long)local_a8);
      } while (local_108 != uVar15);
    }
    local_98 = this;
    local_70 = uVar15;
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar12 = 0;
  }
LAB_001119c6:
  if (local_d8.refcount != (int *)0x0) {
    LOCK();
    *local_d8.refcount = *local_d8.refcount + -1;
    UNLOCK();
    if ((*local_d8.refcount == 0) && (local_d8.data != (void *)0x0)) {
      free(*(void **)((long)local_d8.data + -8));
    }
  }
  return iVar12;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            // fix pad
            if (pad_top != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_top);

                outptr = top_blob.channel(q).row(0);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_bottom + htailpad != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                outptr = top_blob.channel(q).row(outh - 1);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_left != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_left);

                outptr = top_blob.channel(q);
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
            if (pad_right + wtailpad != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                outptr = top_blob.channel(q);
                outptr += outw - 1;
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
        }
    }

    return 0;
}